

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::disassemble::InstructionDisassembler::InstructionDisassembler
          (InstructionDisassembler *this,AssemblyGrammar *grammar,ostream *stream,uint32_t options,
          NameMapper *name_mapper)

{
  int iVar1;
  NameMapper *name_mapper_local;
  uint32_t options_local;
  ostream *stream_local;
  AssemblyGrammar *grammar_local;
  InstructionDisassembler *this_local;
  
  this->grammar_ = grammar;
  this->stream_ = stream;
  this->print_ = (options & 2) == 2;
  this->color_ = (options & 4) == 4;
  iVar1 = 0;
  if ((options & 8) == 8) {
    iVar1 = 0xf;
  }
  this->indent_ = iVar1;
  this->nested_indent_ = (options & 0x100) == 0x100;
  this->comment_ = (uint)((options & 0x80) == 0x80);
  this->show_byte_offset_ = (options & 0x10) == 0x10;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::function(&this->name_mapper_,name_mapper);
  std::
  unordered_map<unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->id_comments_);
  this->last_instruction_comment_alignment_ = 0;
  return;
}

Assistant:

InstructionDisassembler::InstructionDisassembler(const AssemblyGrammar& grammar,
                                                 std::ostream& stream,
                                                 uint32_t options,
                                                 NameMapper name_mapper)
    : grammar_(grammar),
      stream_(stream),
      print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
      color_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_COLOR, options)),
      indent_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_INDENT, options)
                  ? kStandardIndent
                  : 0),
      nested_indent_(
          spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
      comment_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_COMMENT, options)),
      show_byte_offset_(
          spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_SHOW_BYTE_OFFSET, options)),
      name_mapper_(std::move(name_mapper)),
      last_instruction_comment_alignment_(0) {}